

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void get_header(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
               cio_read_buffer *buffer,size_t num_bytes)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  char *reason;
  ushort uVar5;
  cio_websocket_status_code status_code;
  byte bVar6;
  
  if (err == CIO_SUCCESS) {
    bVar1 = *buffer->fetch_ptr;
    buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
    bVar2 = bVar1 >> 7;
    uVar4 = *(uint *)((long)handler_context + 0x10);
    uVar5 = (ushort)uVar4;
    *(ushort *)((long)handler_context + 0x10) = uVar5 & 0xfffe | (ushort)bVar2;
    if ((bVar1 & 0x70) != 0) {
      get_header_cold_1();
      return;
    }
    uVar3 = bVar1 & 0xf;
    bVar6 = (byte)uVar3;
    if (-1 < (char)bVar1 && 7 < bVar6) goto LAB_00105123;
    if ((char)bVar1 < '\0') {
      if (bVar6 == 0) {
        uVar4 = (uVar4 & 0xffff) >> 5;
        if ((uVar4 & 0xf) == 0) goto LAB_00105123;
        uVar5 = (uVar5 & 0xfe00 | (ushort)bVar2) + ((ushort)uVar4 & 0xf) * 2;
      }
      else {
        if (bVar6 < 8 && (uVar4 & 0x1e0) != 0) goto LAB_00105123;
        uVar5 = uVar5 & 0xffe0 | (ushort)bVar2 | (ushort)(byte)(bVar1 * '\x02');
      }
    }
    else {
      if (bVar6 == 0) {
        uVar4 = (uVar4 & 0xffff) >> 5;
        uVar3 = (ushort)uVar4 & 0xf;
        if ((uVar4 & 0xf) == 0) goto LAB_00105123;
        uVar5 = uVar5 & 0xffe0;
      }
      else {
        if ((uVar4 & 0x1e0) != 0) {
LAB_00105123:
          get_header_cold_2();
          return;
        }
        uVar5 = uVar5 & 0xfe00 | uVar3 << 5;
      }
      uVar5 = uVar5 + uVar3 * 2;
    }
    *(ushort *)((long)handler_context + 0x10) = uVar5;
    err = cio_buffered_stream_read_at_least
                    (buffered_stream,buffer,1,get_first_length,handler_context);
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "error while start reading websocket frame length";
  }
  else {
    if (err == CIO_EOF) {
      reason = "connection closed by other peer";
      err = CIO_EOF;
      status_code = CIO_WEBSOCKET_CLOSE_NORMAL;
      goto LAB_00105119;
    }
    reason = "error while reading websocket packet";
  }
  status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
LAB_00105119:
  handle_error((cio_websocket *)handler_context,err,status_code,reason);
  return;
}

Assistant:

static void get_header(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)num_bytes;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	websocket->ws_private.ws_flags.fin = (field & WS_HEADER_FIN) == WS_HEADER_FIN;

	uint8_t rsv_field = field & RSV_MASK;
	if (cio_unlikely(rsv_field != 0)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved bit set in frame");
		return;
	}

	const char *err_msg = handle_fin(websocket, field);
	if (cio_unlikely(err_msg != NULL)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, err_msg);
		return;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, buffer, 1, get_first_length, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket frame length");
	}
}